

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O2

QList<QSize> * __thiscall
QIconLoaderEngine::availableSizes
          (QList<QSize> *__return_storage_ptr__,QIconLoaderEngine *this,Mode mode,State state)

{
  pointer puVar1;
  QIconLoaderEngineEntry *pQVar2;
  unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_> *entry;
  pointer puVar3;
  long in_FS_OFFSET;
  QIcon QStack_58;
  QArrayDataPointer<QSize> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar3 = (this->m_info).entries.
           super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar1 = (this->m_info).entries.
           super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QSize *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QList<QSize>::reserve(__return_storage_ptr__,(long)puVar3 - (long)puVar1 >> 3);
  puVar1 = (this->m_info).entries.
           super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (this->m_info).entries.
                super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    pQVar2 = (puVar3->_M_t).
             super___uniq_ptr_impl<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
             ._M_t.
             super__Tuple_impl<0UL,_QIconLoaderEngineEntry_*,_std::default_delete<QIconLoaderEngineEntry>_>
             .super__Head_base<0UL,_QIconLoaderEngineEntry_*,_false>._M_head_impl;
    if ((pQVar2->dir).type == Fallback) {
      QIcon::QIcon(&QStack_58,&pQVar2->filename);
      QIcon::availableSizes((QList<QSize> *)&local_50,&QStack_58,Normal,Off);
      QList<QSize>::append(__return_storage_ptr__,(QList<QSize> *)&local_50);
      QArrayDataPointer<QSize>::~QArrayDataPointer(&local_50);
      QIcon::~QIcon(&QStack_58);
    }
    else {
      local_50.d._0_4_ = (int)(pQVar2->dir).size;
      local_50.d._4_4_ = (int)local_50.d;
      QList<QSize>::emplaceBack<QSize>(__return_storage_ptr__,(QSize *)&local_50);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QSize> QIconLoaderEngine::availableSizes(QIcon::Mode mode, QIcon::State state)
{
    Q_UNUSED(mode);
    Q_UNUSED(state);

    const qsizetype N = qsizetype(m_info.entries.size());
    QList<QSize> sizes;
    sizes.reserve(N);

    // Gets all sizes from the DirectoryInfo entries
    for (const auto &entry : m_info.entries) {
        if (entry->dir.type == QIconDirInfo::Fallback) {
            sizes.append(QIcon(entry->filename).availableSizes());
        } else {
            int size = entry->dir.size;
            sizes.append(QSize(size, size));
        }
    }
    return sizes;
}